

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems(QGraphicsSceneBspTreeIndexPrivate *this)

{
  Data *pDVar1;
  int i;
  ulong uVar2;
  
  if ((this->purgePending != false) ||
     ((pDVar1 = (this->removedItems).q_hash.d, pDVar1 != (Data *)0x0 && (pDVar1->size != 0)))) {
    QGraphicsSceneBspTree::removeItems(&this->bsp,&this->removedItems);
    QHash<QGraphicsItem_*,_QHashDummyValue>::clear(&(this->removedItems).q_hash);
    QList<int>::clear(&this->freeItemIndexes);
    for (uVar2 = 0; uVar2 < (ulong)(this->indexedItems).d.size; uVar2 = uVar2 + 1) {
      if ((this->indexedItems).d.ptr[uVar2] == (QGraphicsItem *)0x0) {
        QList<int>::append(&this->freeItemIndexes,(parameter_type)uVar2);
      }
    }
    this->purgePending = false;
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems()
{
    if (!purgePending && removedItems.isEmpty())
        return;

    // Remove stale items from the BSP tree.
    bsp.removeItems(removedItems);
    // Purge this list.
    removedItems.clear();
    freeItemIndexes.clear();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (!indexedItems.at(i))
            freeItemIndexes << i;
    }
    purgePending = false;
}